

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O3

PClass * __thiscall DDecalSlider::StaticType(DDecalSlider *this)

{
  return RegistrationInfo.MyClass;
}

Assistant:

void DDecalSlider::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("starttime", TimeToStart)
		("endtime", TimeToStop)
		("disty", DistY)
		("starty", StartY)
		("started", bStarted);
}